

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void __thiscall
pstore::broker::command_processor::suicide
          (command_processor *this,fifo_path *param_1,broker_command *param_2)

{
  shared_ptr<pstore::broker::scavenger> scav;
  undefined4 local_20;
  undefined8 local_18;
  
  atomic_weak_ptr<pstore::broker::scavenger>::get
            ((atomic_weak_ptr<pstore::broker::scavenger> *)&stack0xffffffffffffffe0);
  shutdown((int)this,local_20);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return;
}

Assistant:

void command_processor::suicide (brokerface::fifo_path const &, broker_command const &) {
            std::shared_ptr<scavenger> const scav = scavenger_.get ();
            shutdown (this, scav.get (), sig_self_quit, num_read_threads_, http_status_,
                      uptime_done_);
        }